

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapRegexInfo(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *this;
  SnapRegexInfo *pSVar1;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar2;
  Var local_38;
  Var lastVar;
  SnapRegexInfo *regexInfo;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapRegexInfo*,(TTD::NSSnapObjects::SnapObjectType)17>
                     (snpObject);
  if (pSVar1->LastIndexVar == (TTDVar)0x0) {
    local_38 = (Var)0x0;
  }
  else {
    local_38 = InflateMap::InflateTTDVar(inflator,pSVar1->LastIndexVar);
  }
  this_00 = Js::ScriptContext::GetLibrary(this);
  pRVar2 = Js::JavascriptLibrary::CreateRegex_TTD
                     (this_00,(pSVar1->RegexStr).Contents,(pSVar1->RegexStr).Length,pSVar1->Flags,
                      pSVar1->LastIndexOrFlag,local_38);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapRegexInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //Regexes are not too common and have some mutable state so it seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapRegexInfo* regexInfo = SnapObjectGetAddtlInfoAs<SnapRegexInfo*, SnapObjectType::SnapRegexObject>(snpObject);

            Js::Var lastVar = (regexInfo->LastIndexVar != nullptr) ? inflator->InflateTTDVar(regexInfo->LastIndexVar) : nullptr;

            return ctx->GetLibrary()->CreateRegex_TTD(regexInfo->RegexStr.Contents, regexInfo->RegexStr.Length, regexInfo->Flags, regexInfo->LastIndexOrFlag, lastVar);
        }